

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

LatticeComparison __thiscall
wasm::analysis::Vector<wasm::RandomLattice>::compare
          (Vector<wasm::RandomLattice> *this,Element *a,Element *b)

{
  pointer pRVar1;
  pointer pRVar2;
  LatticeComparison LVar3;
  ulong uVar4;
  long lVar5;
  LatticeComparison LVar6;
  bool bVar7;
  
  pRVar1 = (a->
           super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (a->
           super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pRVar2 - (long)pRVar1;
  if (lVar5 >> 4 != this->size) {
    __assert_fail("a.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x36,
                  "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
                 );
  }
  if ((long)(b->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(b->
            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start != lVar5) {
    __assert_fail("b.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x37,
                  "LatticeComparison wasm::analysis::Vector<wasm::RandomLattice>::compare(const Element &, const Element &) const [L = wasm::RandomLattice]"
                 );
  }
  LVar6 = EQUAL;
  if (pRVar2 != pRVar1) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      LVar3 = RandomLattice::compare
                        (&this->lattice,
                         (Element *)
                         ((long)&(((a->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar5),
                         (Element *)
                         ((long)&(((b->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar5));
      if (LVar3 == LESS) {
        bVar7 = LVar6 == GREATER;
        LVar6 = LESS;
LAB_001a7f3d:
        if (bVar7) {
          return NO_RELATION;
        }
      }
      else {
        if (LVar3 == GREATER) {
          bVar7 = LVar6 == LESS;
          LVar6 = GREATER;
          goto LAB_001a7f3d;
        }
        if (LVar3 == NO_RELATION) {
          return NO_RELATION;
        }
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < this->size);
  }
  return LVar6;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    assert(a.size() == size);
    assert(b.size() == size);
    auto result = EQUAL;
    for (size_t i = 0; i < size; ++i) {
      switch (lattice.compare(a[i], b[i])) {
        case NO_RELATION:
          return NO_RELATION;
        case EQUAL:
          continue;
        case LESS:
          if (result == GREATER) {
            // Cannot be both less and greater.
            return NO_RELATION;
          }
          result = LESS;
          continue;
        case GREATER:
          if (result == LESS) {
            // Cannot be both greater and less.
            return NO_RELATION;
          }
          result = GREATER;
          continue;
      }
    }
    return result;
  }